

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cobs.c
# Opt level: O1

ssize_t mpt_encode_cobs(mpt_encode_state *info,iovec *cobs,iovec *base)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  iovec tmp;
  iovec local_30;
  
  if (cobs == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
    uVar4 = 0;
  }
  else {
    local_30.iov_len = info->done;
    uVar10 = info->scratch;
    uVar12 = cobs->iov_len;
    cVar9 = (char)uVar10;
    if (cobs->iov_base == (void *)0x0) {
      uVar4 = (ulong)-(uint)(((uVar10 & 0xff) != 0 || local_30.iov_len != 0) || uVar12 != 0) |
              0xffffffffffffffef;
    }
    else {
      uVar4 = 0xffffffffffffffff;
      uVar7 = uVar12 - local_30.iov_len;
      if ((local_30.iov_len <= uVar12) && (uVar12 = uVar10 & 0xff, uVar12 <= uVar7)) {
        pcVar6 = (char *)((long)cobs->iov_base + local_30.iov_len);
        if (base == (iovec *)0x0) {
          uVar4 = 0xffffffffffffffef;
          if (uVar12 < uVar7) {
            if (cVar9 == '\0') {
              if (uVar7 < 2) {
                return -0x11;
              }
              pcVar6[0] = '\x01';
              pcVar6[1] = '\0';
              sVar5 = 2;
            }
            else {
              *pcVar6 = cVar9;
              pcVar6[uVar12] = '\0';
              sVar5 = ((int)uVar10 + 1U & 0xff) + local_30.iov_len;
            }
            uVar4 = 0;
            info->_ctx = 0;
            info->done = sVar5;
            info->scratch = 0;
          }
        }
        else {
          sVar5 = base->iov_len;
          if (sVar5 == 0) {
            uVar4 = 0xfffffffffffffffe;
          }
          else {
            pcVar11 = (char *)base->iov_base;
            if (pcVar11 == (char *)0x0) {
              lVar8 = sVar5 + (info->_ctx == 0);
              local_30.iov_base = (void *)0x0;
              do {
                lVar8 = lVar8 + -1;
                if (lVar8 == 0) {
                  info->_ctx = 0;
                  info->done = local_30.iov_len;
                  info->scratch = 0;
                  return local_30.iov_len;
                }
                local_30.iov_len = mpt_memrchr(&local_30,1,0);
              } while (-1 < (long)local_30.iov_len);
              uVar4 = 0xfffffffffffffffe;
            }
            else {
              if (cVar9 == '\0') {
                if (uVar7 < 2) {
                  return -0x11;
                }
                lVar8 = uVar7 - 1;
                uVar10 = 1;
              }
              else {
                lVar8 = uVar7 - uVar12;
                if (lVar8 == 0) {
                  return -0x11;
                }
              }
              pcVar6 = pcVar6 + (uVar10 & 0xff);
              do {
                cVar9 = (char)uVar10;
                sVar2 = sVar5 - 1;
                if (sVar5 == 0) {
                  sVar5 = 0;
LAB_00110fc7:
                  pcVar6[-(uVar10 & 0xff)] = (char)uVar10;
                  bVar1 = false;
                  sVar2 = sVar5;
                }
                else {
                  if (*pcVar11 == '\0') {
                    lVar14 = -(uVar10 & 0xff);
                    lVar13 = -1;
                    lVar15 = 1;
LAB_00110f97:
                    pcVar6[lVar14] = cVar9;
                    pcVar6 = pcVar6 + lVar15;
                    lVar8 = lVar8 + lVar13;
                    uVar3 = 1;
                  }
                  else {
                    *pcVar6 = *pcVar11;
                    uVar3 = (int)uVar10 + 1;
                    if ((char)uVar3 == -1) {
                      if (lVar8 + -1 == 0) {
                        lVar8 = 0;
                        goto LAB_00110fc7;
                      }
                      lVar13 = -2;
                      lVar15 = 2;
                      lVar14 = -0xfe;
                      cVar9 = -1;
                      goto LAB_00110f97;
                    }
                    pcVar6 = pcVar6 + 1;
                    lVar8 = lVar8 + -1;
                  }
                  pcVar11 = pcVar11 + 1;
                  bVar1 = true;
                  uVar10 = (ulong)uVar3;
                  if (lVar8 == 0) {
                    lVar8 = 0;
                    sVar5 = sVar2;
                    goto LAB_00110fc7;
                  }
                }
                sVar5 = sVar2;
              } while (bVar1);
              lVar8 = cobs->iov_len - lVar8;
              info->_ctx = info->_ctx + (lVar8 - (info->done + info->scratch));
              info->done = lVar8 - (uVar10 & 0xff);
              info->scratch = uVar10 & 0xff;
              uVar4 = base->iov_len - sVar2;
            }
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

extern ssize_t mpt_encode_cobs(MPT_STRUCT(encode_state) *info, const struct iovec *cobs, const struct iovec *base)
#endif
{
	const uint8_t *src;
	uint8_t *dst, code;
	size_t left, len;
	
	if (!cobs) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	code = info->scratch;
	len  = info->done;
	left = cobs->iov_len;
	
	/* uninitialized target */
	if (!(dst = cobs->iov_base)) {
		if (code || len || left) {
			return MPT_ERROR(BadArgument);
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* bad encoder state */
	if ((len > left)
	    || (code > (left -= len))
	    || (code > left)) {
		return MPT_ERROR(BadArgument);
	}
	dst += len;
	
	/* message termination */
	if (!base) {
		/* need enough data to save end */
		if (code >= left) {
			return MPT_ERROR(MissingBuffer);
		}
		/* special case: empty message */
		if (!code) {
			if (left < 2) {
				return MPT_ERROR(MissingBuffer);
			}
			/* '\x00\x00' not allowed in cobs data stream.
			 * Decoder consumes single encoded zero. */
			dst[0] = 1;
			dst[1] = 0;
			len = 2;
		}
		/* cobs message termination */
		else {
			*dst = code;
			dst[code++] = 0;
			len += code;
		}
		info->_ctx = 0;
		info->done = len;
		info->scratch = 0;
		
		return 0;
	}
	src = base->iov_base;
	len = base->iov_len;
	
	/* start priority data */
	if (!len) {
		return MPT_ERROR(BadValue);
	}
	/* message deletion */
	if (!src) {
		struct iovec tmp;
		ssize_t pos = info->done;
		
		/* message in progress */
		if (info->_ctx) {
			--len;
		}
		tmp.iov_base = (void *) src;
		while (len--) {
			tmp.iov_len  = pos;
			if ((pos = mpt_memrchr(&tmp, 1, 0)) < 0) {
				return MPT_ERROR(BadValue);
			}
		}
		info->_ctx = 0;
		info->done = pos;
		info->scratch = 0;
		
		/* save start of encoder state for next message */
		return pos;
	}
	
	/* remaining data in cobs */
	if (code) {
		if (!(left -= code)) return MPT_ERROR(MissingBuffer);
	} else {
		if (left <= (code = 1)) return MPT_ERROR(MissingBuffer);
		--left;
	}
	dst += code;
	
	while (1) {
		uint8_t curr;
		
		/* save COBS state */
		if (!len--) {
			dst[-code] = code;
			len = 0;
			break;
		}
		
		/* end of code block */
		if (!(curr = *src++)) {
			code = MPT_cobs_zero(code, dst, left, src, len);
		}
		else {
			*(dst++) = curr; --left;
			/* reached maximum length */
			if (++code == MPT_COBS_MAXLEN) {
				/* unable to save continuation state */
				if (!left) {
					--code; --dst;
					dst[-code] = code;
					++len; --src;
					break;
				}
				/* end of code block */
				dst[-code] = code;
				code = 1;
				dst++;
				left--;
			}
		}
		/* save current state */
		if (!left) {
			dst[-code] = code;
			break;
		}
	}
	
	/* update processed data */
	left = cobs->iov_len - left;
	info->_ctx += left - info->done - info->scratch;
	info->done = left - code;
	info->scratch = code;
	
	/* return consumed size */
	return base->iov_len - len;
}